

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O0

void __thiscall
embree::SceneGraph::PointSetNode::PointSetNode
          (PointSetNode *this,Ref<embree::SceneGraph::PointSetNode> *imesh,Transformations *spaces)

{
  long *plVar1;
  long *in_RSI;
  undefined8 *in_RDI;
  Transformations *in_stack_00000110;
  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  *in_stack_00000118;
  Transformations *in_stack_000001c0;
  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
  *in_stack_000001c8;
  undefined8 in_stack_ffffffffffffff38;
  Node *in_stack_ffffffffffffff40;
  
  Node::Node(in_stack_ffffffffffffff40,SUB81((ulong)in_stack_ffffffffffffff38 >> 0x38,0));
  *in_RDI = &PTR__PointSetNode_005b30c0;
  in_RDI[0xd] = *(undefined8 *)(*in_RSI + 0x68);
  *(undefined4 *)(in_RDI + 0xe) = *(undefined4 *)(*in_RSI + 0x70);
  transformMSMBlurBuffer<embree::Vec3fx>(in_stack_00000118,in_stack_00000110);
  transformMSMBlurNormalBuffer<embree::Vec3fa>(in_stack_000001c8,in_stack_000001c0);
  plVar1 = in_RDI + 0x15;
  *plVar1 = *(long *)(*in_RSI + 0xa8);
  if (*plVar1 != 0) {
    (**(code **)(*(long *)*plVar1 + 0x10))();
  }
  return;
}

Assistant:

PointSetNode (Ref<SceneGraph::PointSetNode> imesh, const Transformations& spaces)
        : Node(true), time_range(imesh->time_range), type(imesh->type), positions(transformMSMBlurBuffer(imesh->positions,spaces)),
          normals(transformMSMBlurNormalBuffer(imesh->normals,spaces)),
        material(imesh->material) {}